

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_data.c
# Opt level: O3

void fiobj_data_seek(FIOBJ io,intptr_t position)

{
  int iVar1;
  int *piVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  stat local_b0;
  
  if (io == 0) {
    return;
  }
  if ((~(uint)io & 6) == 0 || (io & 1) != 0) {
    return;
  }
  if (*(char *)(io & 0xfffffffffffffff8) != '+') {
    return;
  }
  uVar5 = position;
  if (*(uint *)(io + 0x30) < 0xfffffffe) {
    *(undefined8 *)(io + 0x20) = 0;
    *(undefined8 *)(io + 0x28) = 0;
    lVar4 = 0x10;
    if (position == 0) goto LAB_0014130a;
    do {
      iVar1 = fstat(*(int *)(io + 0x30),&local_b0);
      if (iVar1 == 0) goto LAB_00141314;
      piVar2 = __errno_location();
    } while (*piVar2 == 4);
    local_b0.st_size = 0xffffffffffffffff;
LAB_00141314:
    uVar3 = 0;
    if (0 < local_b0.st_size) {
      uVar3 = local_b0.st_size;
    }
    if (0 < position) {
      if (local_b0.st_size < position) {
        uVar5 = uVar3;
      }
      goto LAB_00141342;
    }
  }
  else {
    lVar4 = 0x28;
    if (position == 0) {
LAB_0014130a:
      uVar5 = 0;
      goto LAB_00141342;
    }
    if (0 < position) {
      if (*(ulong *)(io + 0x20) < (ulong)position) {
        uVar5 = *(ulong *)(io + 0x20);
      }
      goto LAB_00141342;
    }
    uVar3 = *(ulong *)(io + 0x20);
  }
  uVar5 = 0;
  if ((ulong)-position <= uVar3) {
    uVar5 = uVar3 + position;
  }
LAB_00141342:
  *(ulong *)(io + lVar4) = uVar5;
  return;
}

Assistant:

void fiobj_data_seek(FIOBJ io, intptr_t position) {
  if (!io || !FIOBJ_TYPE_IS(io, FIOBJ_T_DATA))
    return;
  switch (obj2io(io)->fd) {
  case -1: /* fallthrough */
  case -2:
    /* String / Slice code */
    if (position == 0) {
      obj2io(io)->pos = 0;
      return;
    }
    if (position > 0) {
      if ((uintptr_t)position > obj2io(io)->len)
        position = obj2io(io)->len;
      obj2io(io)->pos = position;
      return;
    }
    position = (0 - position);
    if ((uintptr_t)position > obj2io(io)->len)
      position = 0;
    else
      position = obj2io(io)->len - position;
    obj2io(io)->pos = position;
    return;
    break;
  default:
    /* File code */
    obj2io(io)->pos = 0;
    obj2io(io)->len = 0;

    if (position == 0) {
      obj2io(io)->source.fpos = 0;
      return;
    }
    int64_t len = fiobj_data_get_fd_size(io);
    if (len < 0)
      len = 0;
    if (position > 0) {
      if (position > len)
        position = len;

      obj2io(io)->source.fpos = position;
      return;
    }
    position = (0 - position);
    if (position > len)
      position = 0;
    else
      position = len - position;
    obj2io(io)->source.fpos = position;
    return;
  }
}